

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void Serialize<AutoFile,char>
               (AutoFile *os,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  long lVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>(os,str->_M_string_length);
  if ((void *)str->_M_string_length == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    AutoFile::write(os,(int)(str->_M_dataplus)._M_p,(void *)str->_M_string_length,in_RCX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::basic_string<C>& str)
{
    WriteCompactSize(os, str.size());
    if (!str.empty())
        os.write(MakeByteSpan(str));
}